

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O3

SHADER_TYPE __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetActiveShaderStageType
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,Uint32 StageIndex)

{
  SHADER_TYPE SVar1;
  SHADER_TYPE SVar2;
  char (*Args_1) [40];
  uint uVar3;
  int iVar4;
  string msg;
  string local_38;
  
  SVar1 = this->m_ShaderStages;
  Args_1 = (char (*) [40])(ulong)SVar1;
  uVar3 = SVar1 - (SVar1 >> 1 & 0x55555555);
  uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
  if (((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18 <= StageIndex) {
    FormatString<char[26],char[40]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"StageIndex < GetNumActiveShaderStages()",Args_1);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetActiveShaderStageType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x297);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    Args_1 = (char (*) [40])(ulong)this->m_ShaderStages;
  }
  if ((int)Args_1 != 0) {
    iVar4 = StageIndex + 1;
    do {
      SVar2 = (SHADER_TYPE)Args_1;
      SVar1 = -SVar2 & SVar2;
      iVar4 = iVar4 + -1;
      if (iVar4 == 0) {
        return SVar1;
      }
      Args_1 = (char (*) [40])(ulong)(SVar1 ^ SVar2);
    } while (SVar1 != SVar2);
  }
  FormatString<char[22]>(&local_38,(char (*) [22])0x6a400a);
  DebugAssertionFailed
            (local_38._M_dataplus._M_p,"GetActiveShaderStageType",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
             ,0x2a2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return SHADER_TYPE_UNKNOWN;
}

Assistant:

SHADER_TYPE GetActiveShaderStageType(Uint32 StageIndex) const
    {
        VERIFY_EXPR(StageIndex < GetNumActiveShaderStages());

        SHADER_TYPE Stages = m_ShaderStages;
        for (Uint32 Index = 0; Stages != SHADER_TYPE_UNKNOWN; ++Index)
        {
            SHADER_TYPE StageBit = ExtractLSB(Stages);

            if (Index == StageIndex)
                return StageBit;
        }

        UNEXPECTED("Index is out of range");
        return SHADER_TYPE_UNKNOWN;
    }